

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

string * __thiscall
cfd::core::Address::GetAddress_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->address_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->address_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Address::GetAddress() const { return address_; }